

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_inv_txfm2d_add_8x8_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 in_CL;
  int32_t *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  __m128i *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int8_t *shift;
  __m128i out [16];
  __m128i in [16];
  __m128i *in_stack_fffffffffffffe30;
  __m128i *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  uint16_t *in_stack_fffffffffffffec0;
  __m128i *in_stack_fffffffffffffec8;
  longlong local_128 [36];
  
  switch(in_CL) {
  case 0:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    idct8x8_sse4_1((__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    idct8x8_sse4_1((__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 1:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    idct8x8_sse4_1((__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 2:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    idct8x8_sse4_1((__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 3:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 4:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    idct8x8_sse4_1((__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 5:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    idct8x8_sse4_1((__m128i *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 6:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 7:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
    break;
  case 8:
    load_buffer_8x8(in_RDI,(__m128i *)local_128);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iadst8x8_sse4_1((__m128i *)out[4][0],(__m128i *)out[3][1],out[3][0]._4_4_,(int)out[3][0],
                    out[2][1]._4_4_,(int)out[2][1]);
    write_buffer_8x8(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                     in_stack_00000010);
  }
  return;
}

Assistant:

void av1_inv_txfm2d_add_8x8_sse4_1(const int32_t *input, uint16_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_inv_txfm_shift_ls[TX_8X8];

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 0, -shift[1], bd);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 1, -shift[1], bd);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      idct8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 0, -shift[1], bd);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 1, 1, -shift[1], bd);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 0, bd, -shift[0]);
      transpose_8x8(out, in);
      iadst8x8_sse4_1(in, out, INV_COS_BIT, 1, bd, 0);
      write_buffer_8x8(out, output, stride, 0, 1, -shift[1], bd);
      break;
    default: assert(0);
  }
}